

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O3

void xmlFreeID(xmlIDPtr id)

{
  xmlAttrPtr pxVar1;
  int iVar2;
  xmlChar *pxVar3;
  xmlDictPtr dict;
  
  if (id == (xmlIDPtr)0x0) {
    return;
  }
  if (id->doc == (_xmlDoc *)0x0) {
    pxVar3 = id->value;
    if (pxVar3 != (xmlChar *)0x0) {
LAB_0015a84f:
      dict = (xmlDictPtr)0x0;
LAB_0015a852:
      (*xmlFree)(pxVar3);
      goto LAB_0015a85e;
    }
    pxVar3 = id->name;
    if (pxVar3 == (xmlChar *)0x0) goto LAB_0015a893;
  }
  else {
    dict = id->doc->dict;
    pxVar3 = id->value;
    if (pxVar3 != (xmlChar *)0x0) {
      if (dict == (xmlDictPtr)0x0) goto LAB_0015a84f;
      iVar2 = xmlDictOwns(dict,pxVar3);
      if (iVar2 == 0) {
        pxVar3 = id->value;
        goto LAB_0015a852;
      }
    }
LAB_0015a85e:
    pxVar3 = id->name;
    if (pxVar3 == (xmlChar *)0x0) goto LAB_0015a893;
    if (dict != (xmlDictPtr)0x0) {
      iVar2 = xmlDictOwns(dict,pxVar3);
      if (iVar2 != 0) goto LAB_0015a893;
      pxVar3 = id->name;
    }
  }
  (*xmlFree)(pxVar3);
LAB_0015a893:
  pxVar1 = id->attr;
  if (pxVar1 != (xmlAttrPtr)0x0) {
    pxVar1->id = (_xmlID *)0x0;
    pxVar1->atype = 0;
  }
  (*xmlFree)(id);
  return;
}

Assistant:

static void
xmlFreeID(xmlIDPtr id) {
    xmlDictPtr dict = NULL;

    if (id == NULL) return;

    if (id->doc != NULL)
        dict = id->doc->dict;

    if (id->value != NULL)
	DICT_FREE(id->value)
    if (id->name != NULL)
	DICT_FREE(id->name)
    if (id->attr != NULL) {
        id->attr->id = NULL;
        id->attr->atype = 0;
    }

    xmlFree(id);
}